

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

lu_mem traversethread(global_State *g,lua_State *th)

{
  int iVar1;
  StkId pTVar2;
  StkId lim;
  StkId o;
  lua_State *th_local;
  global_State *g_local;
  
  lim = th->stack;
  if (lim == (StkId)0x0) {
    g_local = (global_State *)&DAT_00000001;
  }
  else {
    for (; lim < th->top; lim = lim + 1) {
      if (((lim->tt_ & 0x40U) != 0) && ((((lim->value_).gc)->marked & 3) != 0)) {
        reallymarkobject(g,(lim->value_).gc);
      }
    }
    if (g->gcstate == '\b') {
      pTVar2 = th->stack;
      iVar1 = th->stacksize;
      for (; lim < pTVar2 + iVar1; lim = lim + 1) {
        lim->tt_ = 0;
      }
      if ((th->twups == th) && (th->openupval != (UpVal *)0x0)) {
        th->twups = g->twups;
        g->twups = th;
      }
    }
    else if (g->gckind != '\x01') {
      luaD_shrinkstack(th);
    }
    g_local = (global_State *)((long)th->stacksize * 0x10 + 0xd0 + (ulong)th->nci * 0x48);
  }
  return (lu_mem)g_local;
}

Assistant:

static lu_mem traversethread (global_State *g, lua_State *th) {
  StkId o = th->stack;
  if (o == NULL)
    return 1;  /* stack not completely built yet */
  lua_assert(g->gcstate == GCSinsideatomic ||
             th->openupval == NULL || isintwups(th));
  for (; o < th->top; o++)  /* mark live elements in the stack */
    markvalue(g, o);
  if (g->gcstate == GCSinsideatomic) {  /* final traversal? */
    StkId lim = th->stack + th->stacksize;  /* real end of stack */
    for (; o < lim; o++)  /* clear not-marked stack slice */
      setnilvalue(o);
    /* 'remarkupvals' may have removed thread from 'twups' list */
    if (!isintwups(th) && th->openupval != NULL) {
      th->twups = g->twups;  /* link it back to the list */
      g->twups = th;
    }
  }
  else if (g->gckind != KGC_EMERGENCY)
    luaD_shrinkstack(th); /* do not change stack in emergency cycle */
  return (sizeof(lua_State) + sizeof(TValue) * th->stacksize +
          sizeof(CallInfo) * th->nci);
}